

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location_impl.hpp
# Opt level: O1

location * toml::detail::make_temporary_location(location *__return_storage_ptr__,string *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  size_type sVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  container_type cont;
  allocator_type local_59;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  char *local_38;
  size_type local_30;
  char local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_58,str->_M_string_length,&local_59);
  sVar2 = str->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (str->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      *(char *)((long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + sVar5) = pcVar3[sVar5];
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  p_Var4->_M_use_count = 1;
  p_Var4->_M_weak_count = 1;
  p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00569710;
  p_Var4[1]._vptr__Sp_counted_base =
       (_func_int **)
       local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)&p_Var4[1]._M_use_count =
       local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  p_Var4[2]._vptr__Sp_counted_base =
       (_func_int **)
       local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"internal temporary","");
  (__return_storage_ptr__->source_).
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)(p_Var4 + 1);
  (__return_storage_ptr__->source_).
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var4;
  paVar1 = &(__return_storage_ptr__->source_name_).field_2;
  (__return_storage_ptr__->source_name_)._M_dataplus._M_p = (pointer)paVar1;
  if (local_38 == &local_28) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_27,local_28);
    *(undefined8 *)((long)&(__return_storage_ptr__->source_name_).field_2 + 8) = uStack_20;
  }
  else {
    (__return_storage_ptr__->source_name_)._M_dataplus._M_p = local_38;
    (__return_storage_ptr__->source_name_).field_2._M_allocated_capacity =
         CONCAT71(uStack_27,local_28);
  }
  (__return_storage_ptr__->source_name_)._M_string_length = local_30;
  local_30 = 0;
  local_28 = '\0';
  __return_storage_ptr__->location_ = 0;
  __return_storage_ptr__->line_number_ = 1;
  __return_storage_ptr__->column_number_ = 1;
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    local_38 = &local_28;
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE location make_temporary_location(const std::string& str) noexcept
{
    location::container_type cont(str.size());
    std::transform(str.begin(), str.end(), cont.begin(),
        [](const std::string::value_type& c) {
            return cxx::bit_cast<location::char_type>(c);
        });
    return location(std::make_shared<const location::container_type>(
            std::move(cont)), "internal temporary");
}